

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O2

void __thiscall
helics::Endpoint::setCallback
          (Endpoint *this,
          function<void_(const_helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)>
          *callback)

{
  MessageFederate *this_00;
  function<void_(helics::Endpoint_&,_TimeRepresentation<count_time<9,_long>_>)> fStack_38;
  
  this_00 = this->fed;
  if (this_00 != (MessageFederate *)0x0) {
    std::function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)>::
    function<std::function<void(helics::Endpoint_const&,TimeRepresentation<count_time<9,long>>)>const&,void>
              ((function<void(helics::Endpoint&,TimeRepresentation<count_time<9,long>>)> *)
               &fStack_38,callback);
    helics::MessageFederate::setMessageNotificationCallback(this_00,this,&fStack_38);
    CLI::std::_Function_base::~_Function_base((_Function_base *)&fStack_38);
  }
  return;
}

Assistant:

void Endpoint::setCallback(const std::function<void(const Endpoint&, Time)>& callback)
{
    if (fed != nullptr) {
        fed->setMessageNotificationCallback(*this, callback);
    }
}